

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

optional<double> slang::parseDouble(string_view name,string_view value,string *error)

{
  undefined4 uVar1;
  size_t *pos_00;
  slang *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  _Storage<double,_true> _Var2;
  string_view str;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  optional<double> oVar3;
  size_t pos;
  string local_78;
  string local_58;
  
  local_78._M_dataplus._M_p = name._M_str;
  local_78._M_string_length = name._M_len;
  pos_00 = (size_t *)value._M_str;
  this = (slang *)value._M_len;
  if (this == (slang *)0x0) {
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_78;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x20;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_58,(v9 *)"expected value for argument \'{}\'",fmt_00,args_00);
    std::__cxx11::string::operator=((string *)error,(string *)&local_58);
    _Var2._M_value = (double)std::__cxx11::string::~string((string *)&local_58);
    uVar1 = 0;
  }
  else {
    str._M_str = (char *)&pos;
    str._M_len = (size_t)pos_00;
    oVar3 = strToDouble(this,str,pos_00);
    _Var2 = oVar3.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    uVar1 = oVar3.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._8_4_;
    if ((((undefined1  [16])
          oVar3.super__Optional_base<double,_true,_true>._M_payload.
          super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((slang *)pos != this)) {
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0x2a;
      local_58._M_dataplus._M_p = (pointer)pos_00;
      local_58._M_string_length = (size_type)this;
      local_58.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
      local_58.field_2._8_8_ = local_78._M_string_length;
      ::fmt::v9::vformat_abi_cxx11_
                (&local_78,(v9 *)"invalid value \'{}\' for float argument \'{}\'",fmt,args);
      std::__cxx11::string::operator=((string *)error,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_4_ = uVar1;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = _Var2;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> parseDouble(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    size_t pos;
    std::optional<double> val = strToDouble(value, &pos);
    if (!val || pos != value.size())
        error = fmt::format("invalid value '{}' for float argument '{}'", value, name);

    return val;
}